

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SplitLargeMeshes.cpp
# Opt level: O2

void __thiscall
Assimp::SplitLargeMeshesProcess_Vertex::SplitMesh
          (SplitLargeMeshesProcess_Vertex *this,uint a,aiMesh *pMesh,
          vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
          *avList)

{
  aiColor4D *paVar1;
  aiColor4D *paVar2;
  aiVector3D *paVar3;
  aiBone *paVar4;
  ulong uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  pointer paVar21;
  pointer paVar22;
  bool bVar23;
  uint uVar24;
  uint uVar25;
  uint *elem;
  VertexWeightTable *pVVar26;
  aiVertexWeight this_00;
  aiBone **ppaVar27;
  pointer puVar28;
  aiVector3D *paVar29;
  void *pvVar30;
  uint *puVar31;
  aiBone *paVar32;
  aiBone *this_01;
  ulong uVar33;
  aiVertexWeight *__s;
  ulong *puVar34;
  aiFace *paVar35;
  uint uVar36;
  uint uVar37;
  pointer ppVar38;
  aiFace *paVar39;
  int iVar40;
  uint p;
  long lVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  const_iterator iter;
  pointer ppVar45;
  aiBone **local_4c8;
  vector<aiFace,_std::allocator<aiFace>_> vFaces;
  vector<unsigned_int,_std::allocator<unsigned_int>_> avWasCopied;
  undefined1 local_438 [8];
  uint *local_430;
  
  if (this->LIMIT < pMesh->mNumVertices) {
    pVVar26 = ComputeVertexBoneWeightTable(pMesh);
    uVar37 = pMesh->mNumVertices;
    uVar25 = this->LIMIT;
    avWasCopied.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    avWasCopied.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    avWasCopied.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_438._0_4_ = 0xffffffff;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&avWasCopied,(ulong)uVar37,(value_type_conflict1 *)local_438);
    uVar5 = (ulong)pMesh->mNumFaces / (ulong)(uVar37 / uVar25 + 1);
    uVar37 = 0;
    do {
      uVar25 = this->LIMIT;
      this_00 = (aiVertexWeight)operator_new(0x520);
      aiMesh::aiMesh((aiMesh *)this_00);
      *(uint *)((long)this_00 + 4) = 0;
      *(uint *)((long)this_00 + 0xe8) = pMesh->mMaterialIndex;
      if (this_00 != (aiVertexWeight)pMesh) {
        uVar24 = (pMesh->mName).length;
        ((aiString *)((long)this_00 + 0xec))->length = uVar24;
        memcpy((char *)((long)this_00 + 0xf0),(pMesh->mName).data,(ulong)uVar24);
        ((char *)((long)this_00 + 0xf0))[uVar24] = '\0';
      }
      if (pMesh->mNumBones != 0 && pMesh->mBones != (aiBone **)0x0) {
        uVar42 = (ulong)pMesh->mNumBones << 3;
        ppaVar27 = (aiBone **)operator_new__(uVar42);
        *(aiBone ***)((long)this_00 + 0xe0) = ppaVar27;
        memset(ppaVar27,0,uVar42);
      }
      puVar28 = avWasCopied.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (uVar37 != 0) {
        for (; puVar28 !=
               avWasCopied.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish; puVar28 = puVar28 + 1) {
          *puVar28 = 0xffffffff;
        }
      }
      vFaces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      vFaces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      vFaces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      uVar24 = pMesh->mNumVertices;
      uVar42 = (ulong)uVar25;
      if (uVar24 != 0 && pMesh->mVertices != (aiVector3D *)0x0) {
        paVar29 = (aiVector3D *)operator_new__(uVar42 * 0xc);
        if (uVar25 != 0) {
          uVar43 = uVar42 * 0xc - 0xc;
          memset(paVar29,0,(uVar43 - uVar43 % 0xc) + 0xc);
        }
        *(aiVector3D **)((long)this_00 + 0x10) = paVar29;
      }
      if (pMesh->mNormals != (aiVector3D *)0x0 && uVar24 != 0) {
        paVar29 = (aiVector3D *)operator_new__(uVar42 * 0xc);
        if (uVar25 != 0) {
          uVar43 = uVar42 * 0xc - 0xc;
          memset(paVar29,0,(uVar43 - uVar43 % 0xc) + 0xc);
        }
        *(aiVector3D **)((long)this_00 + 0x18) = paVar29;
      }
      bVar23 = aiMesh::HasTangentsAndBitangents(pMesh);
      if (bVar23) {
        uVar43 = uVar42 * 0xc;
        paVar29 = (aiVector3D *)operator_new__(uVar43);
        if (uVar25 != 0) {
          memset(paVar29,0,((uVar43 - 0xc) - (uVar43 - 0xc) % 0xc) + 0xc);
        }
        *(aiVector3D **)((long)this_00 + 0x20) = paVar29;
        paVar29 = (aiVector3D *)operator_new__(uVar43);
        if (uVar25 != 0) {
          memset(paVar29,0,((uVar43 - 0xc) - (uVar43 - 0xc) % 0xc) + 0xc);
        }
        *(aiVector3D **)((long)this_00 + 0x28) = paVar29;
      }
      lVar41 = 6;
      while (((lVar41 != 0xe && (pMesh->mColors[lVar41 + -6] != (aiColor4D *)0x0)) &&
             (pMesh->mNumVertices != 0))) {
        pvVar30 = operator_new__(uVar42 << 4);
        if (uVar25 != 0) {
          memset(pvVar30,0,uVar42 << 4);
        }
        *(void **)((long)this_00 + lVar41 * 8) = pvVar30;
        lVar41 = lVar41 + 1;
      }
      uVar42 = uVar42 * 0xc;
      lVar41 = 0;
      while (((lVar41 != 0x20 && (*(long *)((long)pMesh->mTextureCoords + lVar41 * 2) != 0)) &&
             (pMesh->mNumVertices != 0))) {
        *(undefined4 *)((long)((long)this_00 + 0xb0) + lVar41) =
             *(undefined4 *)((long)pMesh->mNumUVComponents + lVar41);
        pvVar30 = operator_new__(uVar42);
        if (uVar25 != 0) {
          memset(pvVar30,0,uVar42 - (uVar42 - 0xc) % 0xc);
        }
        *(void **)((long)((long)this_00 + 0x70) + lVar41 * 2) = pvVar30;
        lVar41 = lVar41 + 4;
      }
      std::vector<aiFace,_std::allocator<aiFace>_>::reserve
                (&vFaces,(ulong)(uint)((int)(uVar5 >> 3) + (int)uVar5));
      do {
        if (pMesh->mNumFaces <= uVar37) break;
        uVar24 = pMesh->mFaces[uVar37].mNumIndices;
        uVar43 = (ulong)uVar24;
        iVar40 = 0;
        for (uVar42 = 0; uVar43 != uVar42; uVar42 = uVar42 + 1) {
          iVar40 = iVar40 + (uint)(avWasCopied.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start
                                   [pMesh->mFaces[uVar37].mIndices[uVar42]] == 0xffffffff);
        }
        if (uVar25 < iVar40 + *(uint *)((long)this_00 + 4)) break;
        local_438 = (undefined1  [8])((ulong)local_438 & 0xffffffff00000000);
        local_430 = (uint *)0x0;
        std::vector<aiFace,_std::allocator<aiFace>_>::emplace_back<aiFace>
                  (&vFaces,(aiFace *)local_438);
        aiFace::~aiFace((aiFace *)local_438);
        paVar21 = vFaces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        vFaces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data.
        _M_finish[-1].mNumIndices = uVar24;
        puVar31 = (uint *)operator_new__(uVar43 * 4);
        paVar21[-1].mIndices = puVar31;
        uVar36 = paVar21[-1].mNumIndices - 1;
        uVar24 = 8;
        if (uVar36 < 3) {
          uVar24 = *(uint *)(&DAT_001cfcbc + (ulong)uVar36 * 4);
        }
        *(uint *)this_00 = uVar24 | *(uint *)this_00;
        for (uVar42 = 0; uVar42 != uVar43; uVar42 = uVar42 + 1) {
          uVar24 = pMesh->mFaces[uVar37].mIndices[uVar42];
          if (avWasCopied.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar24] == 0xffffffff) {
            paVar29 = pMesh->mVertices;
            paVar3 = *(aiVector3D **)((long)this_00 + 0x10);
            uVar36 = *(uint *)((long)this_00 + 4);
            paVar3[uVar36].z = paVar29[uVar24].z;
            paVar29 = paVar29 + uVar24;
            fVar6 = paVar29->y;
            paVar3 = paVar3 + uVar36;
            paVar3->x = paVar29->x;
            paVar3->y = fVar6;
            paVar29 = pMesh->mNormals;
            if ((paVar29 != (aiVector3D *)0x0) && (pMesh->mNumVertices != 0)) {
              paVar3 = *(aiVector3D **)((long)this_00 + 0x18);
              uVar36 = *(uint *)((long)this_00 + 4);
              paVar3[uVar36].z = paVar29[uVar24].z;
              fVar6 = paVar29[uVar24].y;
              paVar3 = paVar3 + uVar36;
              paVar3->x = paVar29[uVar24].x;
              paVar3->y = fVar6;
            }
            bVar23 = aiMesh::HasTangentsAndBitangents(pMesh);
            if (bVar23) {
              paVar29 = pMesh->mTangents;
              paVar3 = *(aiVector3D **)((long)this_00 + 0x20);
              uVar36 = *(uint *)((long)this_00 + 4);
              paVar3[uVar36].z = paVar29[uVar24].z;
              paVar29 = paVar29 + uVar24;
              fVar6 = paVar29->y;
              paVar3 = paVar3 + uVar36;
              paVar3->x = paVar29->x;
              paVar3->y = fVar6;
              paVar29 = pMesh->mBitangents;
              paVar3 = *(aiVector3D **)((long)this_00 + 0x28);
              uVar36 = *(uint *)((long)this_00 + 4);
              paVar3[uVar36].z = paVar29[uVar24].z;
              paVar29 = paVar29 + uVar24;
              fVar6 = paVar29->y;
              paVar3 = paVar3 + uVar36;
              paVar3->x = paVar29->x;
              paVar3->y = fVar6;
            }
            for (lVar41 = 0; lVar41 != 8; lVar41 = lVar41 + 1) {
              paVar29 = pMesh->mTextureCoords[lVar41];
              if ((paVar29 != (aiVector3D *)0x0) && (pMesh->mNumVertices != 0)) {
                paVar3 = ((aiVector3D **)((long)this_00 + 0x70))[lVar41];
                uVar36 = *(uint *)((long)this_00 + 4);
                paVar3[uVar36].z = paVar29[uVar24].z;
                fVar6 = paVar29[uVar24].y;
                paVar3 = paVar3 + uVar36;
                paVar3->x = paVar29[uVar24].x;
                paVar3->y = fVar6;
              }
            }
            for (lVar41 = 0; lVar41 != 8; lVar41 = lVar41 + 1) {
              if ((pMesh->mColors[lVar41] != (aiColor4D *)0x0) && (pMesh->mNumVertices != 0)) {
                paVar1 = pMesh->mColors[lVar41] + uVar24;
                fVar6 = paVar1->g;
                fVar7 = paVar1->b;
                fVar8 = paVar1->a;
                paVar2 = ((aiColor4D **)((long)this_00 + 0x30))[lVar41] +
                         *(uint *)((long)this_00 + 4);
                paVar2->r = paVar1->r;
                paVar2->g = fVar6;
                paVar2->b = fVar7;
                paVar2->a = fVar8;
              }
            }
            uVar36 = *(uint *)((long)this_00 + 4);
            paVar21[-1].mIndices[uVar42] = uVar36;
            if (pVVar26 != (VertexWeightTable *)0x0) {
              ppVar45 = pVVar26[uVar36].
                        super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              ppVar38 = pVVar26[uVar36].
                        super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              if (ppVar45 != ppVar38) {
                for (; ppVar45 != ppVar38; ppVar45 = ppVar45 + 1) {
                  ppaVar27 = *(aiBone ***)((long)this_00 + 0xe0);
                  paVar32 = ppaVar27[ppVar45->first];
                  if (paVar32 == (aiBone *)0x0) {
                    paVar32 = (aiBone *)operator_new(0x18);
                    (paVar32->mName).data[0xc] = '\0';
                    (paVar32->mName).data[0xd] = '\0';
                    (paVar32->mName).data[0xe] = '\0';
                    (paVar32->mName).data[0xf] = '\0';
                    (paVar32->mName).data[0x10] = '\0';
                    (paVar32->mName).data[0x11] = '\0';
                    (paVar32->mName).data[0x12] = '\0';
                    (paVar32->mName).data[0x13] = '\0';
                    (paVar32->mName).length = 0;
                    (paVar32->mName).data[0] = '\0';
                    (paVar32->mName).data[1] = '\0';
                    (paVar32->mName).data[2] = '\0';
                    (paVar32->mName).data[3] = '\0';
                    (paVar32->mName).data[4] = '\0';
                    (paVar32->mName).data[5] = '\0';
                    (paVar32->mName).data[6] = '\0';
                    (paVar32->mName).data[7] = '\0';
                    (paVar32->mName).data[8] = '\0';
                    (paVar32->mName).data[9] = '\0';
                    (paVar32->mName).data[10] = '\0';
                    (paVar32->mName).data[0xb] = '\0';
                    ppaVar27[ppVar45->first] = paVar32;
                  }
                  local_438._4_4_ = ppVar45->second;
                  local_438._0_4_ = *(uint *)((long)this_00 + 4);
                  std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::
                  emplace_back<aiVertexWeight>
                            ((vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)paVar32,
                             (aiVertexWeight *)local_438);
                  ppVar38 = pVVar26[uVar36].
                            super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                }
                uVar36 = *(uint *)((long)this_00 + 4);
              }
            }
            avWasCopied.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar24] = uVar36;
            *(uint *)((long)this_00 + 4) = *(uint *)((long)this_00 + 4) + 1;
          }
          else {
            paVar21[-1].mIndices[uVar42] =
                 avWasCopied.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                 .super__Vector_impl_data._M_start[uVar24];
          }
        }
        uVar37 = uVar37 + 1;
      } while (*(uint *)((long)this_00 + 4) != uVar25);
      uVar25 = pMesh->mNumBones;
      if (uVar25 != 0 && pMesh->mBones != (aiBone **)0x0) {
        local_4c8 = *(aiBone ***)((long)this_00 + 0xe0);
        for (uVar42 = 0; uVar42 < uVar25; uVar42 = uVar42 + 1) {
          paVar32 = (*(aiBone ***)((long)this_00 + 0xe0))[uVar42];
          if (paVar32 != (aiBone *)0x0) {
            paVar4 = pMesh->mBones[uVar42];
            this_01 = (aiBone *)operator_new(0x450);
            aiBone::aiBone(this_01);
            *local_4c8 = this_01;
            uVar25 = (paVar4->mName).length;
            if (0x3fe < uVar25) {
              uVar25 = 0x3ff;
            }
            uVar43 = (ulong)uVar25;
            local_438._0_4_ = uVar25;
            memcpy(local_438 + 4,(paVar4->mName).data,uVar43);
            local_438[uVar43 + 4] = 0;
            (this_01->mName).length = uVar25;
            memcpy((this_01->mName).data,local_438 + 4,uVar43);
            (this_01->mName).data[uVar43] = '\0';
            fVar17 = (paVar4->mOffsetMatrix).a1;
            fVar18 = (paVar4->mOffsetMatrix).a2;
            fVar19 = (paVar4->mOffsetMatrix).a3;
            fVar20 = (paVar4->mOffsetMatrix).a4;
            fVar13 = (paVar4->mOffsetMatrix).b1;
            fVar14 = (paVar4->mOffsetMatrix).b2;
            fVar15 = (paVar4->mOffsetMatrix).b3;
            fVar16 = (paVar4->mOffsetMatrix).b4;
            fVar9 = (paVar4->mOffsetMatrix).c1;
            fVar10 = (paVar4->mOffsetMatrix).c2;
            fVar11 = (paVar4->mOffsetMatrix).c3;
            fVar12 = (paVar4->mOffsetMatrix).c4;
            fVar6 = (paVar4->mOffsetMatrix).d2;
            fVar7 = (paVar4->mOffsetMatrix).d3;
            fVar8 = (paVar4->mOffsetMatrix).d4;
            (this_01->mOffsetMatrix).d1 = (paVar4->mOffsetMatrix).d1;
            (this_01->mOffsetMatrix).d2 = fVar6;
            (this_01->mOffsetMatrix).d3 = fVar7;
            (this_01->mOffsetMatrix).d4 = fVar8;
            (this_01->mOffsetMatrix).c1 = fVar9;
            (this_01->mOffsetMatrix).c2 = fVar10;
            (this_01->mOffsetMatrix).c3 = fVar11;
            (this_01->mOffsetMatrix).c4 = fVar12;
            (this_01->mOffsetMatrix).b1 = fVar13;
            (this_01->mOffsetMatrix).b2 = fVar14;
            (this_01->mOffsetMatrix).b3 = fVar15;
            (this_01->mOffsetMatrix).b4 = fVar16;
            (this_01->mOffsetMatrix).a1 = fVar17;
            (this_01->mOffsetMatrix).a2 = fVar18;
            (this_01->mOffsetMatrix).a3 = fVar19;
            (this_01->mOffsetMatrix).a4 = fVar20;
            uVar44 = (long)*(pointer *)((paVar32->mName).data + 4) - *(long *)&paVar32->mName;
            uVar33 = (long)uVar44 >> 3;
            this_01->mNumWeights = (uint)uVar33;
            uVar33 = uVar33 & 0xffffffff;
            uVar43 = uVar33 * 8;
            __s = (aiVertexWeight *)operator_new__(uVar43);
            if (uVar33 != 0) {
              memset(__s,0,uVar43);
            }
            local_4c8 = local_4c8 + 1;
            this_01->mWeights = __s;
            memcpy(__s,*(void **)&paVar32->mName,uVar44 & 0x7fffffff8);
            std::_Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>::~_Vector_base
                      ((_Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)paVar32);
            operator_delete(paVar32);
            *(uint *)((long)this_00 + 0xd8) = *(uint *)((long)this_00 + 0xd8) + 1;
            uVar25 = pMesh->mNumBones;
          }
        }
      }
      paVar22 = vFaces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                super__Vector_impl_data._M_finish;
      paVar21 = vFaces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar43 = (long)vFaces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)vFaces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                     super__Vector_impl_data._M_start;
      uVar42 = (long)uVar43 >> 4;
      puVar34 = (ulong *)operator_new__(-(ulong)(uVar42 >> 0x3c != 0) | uVar43 | 8);
      *puVar34 = uVar42;
      paVar35 = (aiFace *)(puVar34 + 1);
      if (paVar22 != paVar21) {
        paVar39 = paVar35;
        do {
          paVar39->mNumIndices = 0;
          paVar39->mIndices = (uint *)0x0;
          paVar39 = paVar39 + 1;
        } while (paVar39 != (aiFace *)(uVar43 + (long)paVar35));
      }
      *(aiFace **)((long)this_00 + 0xd0) = paVar35;
      *(uint *)((long)this_00 + 8) = (uint)uVar42;
      lVar41 = 0;
      for (uVar43 = 0; uVar43 < (uVar42 & 0xffffffff); uVar43 = uVar43 + 1) {
        aiFace::operator=((aiFace *)
                          ((long)&(*(aiFace **)((long)this_00 + 0xd0))->mNumIndices + lVar41),
                          (aiFace *)
                          ((long)&(vFaces.super__Vector_base<aiFace,_std::allocator<aiFace>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->mNumIndices + lVar41))
        ;
        uVar42 = (ulong)*(uint *)((long)this_00 + 8);
        lVar41 = lVar41 + 0x10;
      }
      local_430 = (uint *)CONCAT44(local_430._4_4_,a);
      local_438 = (undefined1  [8])this_00;
      std::vector<std::pair<aiMesh*,unsigned_int>,std::allocator<std::pair<aiMesh*,unsigned_int>>>::
      emplace_back<std::pair<aiMesh*,unsigned_int>>
                ((vector<std::pair<aiMesh*,unsigned_int>,std::allocator<std::pair<aiMesh*,unsigned_int>>>
                  *)avList,(pair<aiMesh_*,_unsigned_int> *)local_438);
      uVar25 = pMesh->mNumFaces;
      std::vector<aiFace,_std::allocator<aiFace>_>::~vector(&vFaces);
    } while (uVar37 != uVar25);
    if (pVVar26 != (VertexWeightTable *)0x0) {
      ppVar45 = pVVar26[-1].
                super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (ppVar45 != (pointer)0x0) {
        lVar41 = (long)ppVar45 * 0x18;
        do {
          std::
          _Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
          ::~_Vector_base((_Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                           *)((long)&pVVar26[-1].
                                     super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar41));
          lVar41 = lVar41 + -0x18;
        } while (lVar41 != 0);
      }
      operator_delete__(&pVVar26[-1].
                         super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    aiMesh::~aiMesh(pMesh);
    operator_delete(pMesh);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&avWasCopied.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  }
  else {
    local_430 = (uint *)CONCAT44(local_430._4_4_,a);
    local_438 = (undefined1  [8])pMesh;
    std::vector<std::pair<aiMesh*,unsigned_int>,std::allocator<std::pair<aiMesh*,unsigned_int>>>::
    emplace_back<std::pair<aiMesh*,unsigned_int>>
              ((vector<std::pair<aiMesh*,unsigned_int>,std::allocator<std::pair<aiMesh*,unsigned_int>>>
                *)avList,(pair<aiMesh_*,_unsigned_int> *)local_438);
  }
  return;
}

Assistant:

void SplitLargeMeshesProcess_Vertex::SplitMesh(
        unsigned int a,
        aiMesh* pMesh,
        std::vector<std::pair<aiMesh*, unsigned int> >& avList) {
    if (pMesh->mNumVertices > SplitLargeMeshesProcess_Vertex::LIMIT) {
        typedef std::vector< std::pair<unsigned int,float> > VertexWeightTable;

        // build a per-vertex weight list if necessary
        VertexWeightTable* avPerVertexWeights = ComputeVertexBoneWeightTable(pMesh);

        // we need to split this mesh into sub meshes
        // determine the estimated size of a submesh
        // (this could be too large. Max waste is a single digit percentage)
        const unsigned int iSubMeshes = (pMesh->mNumVertices / SplitLargeMeshesProcess_Vertex::LIMIT) + 1;

        // create a std::vector<unsigned int> to indicate which vertices
        // have already been copied
        std::vector<unsigned int> avWasCopied;
        avWasCopied.resize(pMesh->mNumVertices,0xFFFFFFFF);

        // try to find a good estimate for the number of output faces
        // per mesh. Add 12.5% as buffer
        unsigned int iEstimatedSize = pMesh->mNumFaces / iSubMeshes;
        iEstimatedSize += iEstimatedSize >> 3;

        // now generate all submeshes
        unsigned int iBase( 0 );
        while (true) {
            const unsigned int iOutVertexNum = SplitLargeMeshesProcess_Vertex::LIMIT;
            aiMesh* pcMesh          = new aiMesh;
            pcMesh->mNumVertices    = 0;
            pcMesh->mMaterialIndex  = pMesh->mMaterialIndex;

            // the name carries the adjacency information between the meshes
            pcMesh->mName = pMesh->mName;

            typedef std::vector<aiVertexWeight> BoneWeightList;
            if (pMesh->HasBones()) {
                pcMesh->mBones = new aiBone*[pMesh->mNumBones];
                ::memset(pcMesh->mBones,0,sizeof(void*)*pMesh->mNumBones);
            }

            // clear the temporary helper array
            if (iBase) {
                // we can't use memset here we unsigned int needn' be 32 bits
                for (auto &elem : avWasCopied) {
                    elem = 0xffffffff;
                }
            }

            // output vectors
            std::vector<aiFace> vFaces;

            // reserve enough storage for most cases
            if (pMesh->HasPositions()) {
                pcMesh->mVertices = new aiVector3D[iOutVertexNum];
            }
            if (pMesh->HasNormals()) {
                pcMesh->mNormals = new aiVector3D[iOutVertexNum];
            }
            if (pMesh->HasTangentsAndBitangents()) {
                pcMesh->mTangents = new aiVector3D[iOutVertexNum];
                pcMesh->mBitangents = new aiVector3D[iOutVertexNum];
            }
            for (unsigned int c = 0; pMesh->HasVertexColors(c);++c) {
                pcMesh->mColors[c] = new aiColor4D[iOutVertexNum];
            }
            for (unsigned int c = 0; pMesh->HasTextureCoords(c);++c) {
                pcMesh->mNumUVComponents[c] = pMesh->mNumUVComponents[c];
                pcMesh->mTextureCoords[c] = new aiVector3D[iOutVertexNum];
            }
            vFaces.reserve(iEstimatedSize);

            // (we will also need to copy the array of indices)
            while (iBase < pMesh->mNumFaces) {
                // allocate a new array
                const unsigned int iNumIndices = pMesh->mFaces[iBase].mNumIndices;

                // doesn't catch degenerates but is quite fast
                unsigned int iNeed = 0;
                for (unsigned int v = 0; v < iNumIndices;++v) {
                    unsigned int iIndex = pMesh->mFaces[iBase].mIndices[v];

                    // check whether we do already have this vertex
                    if (0xFFFFFFFF == avWasCopied[iIndex]) {
                        iNeed++;
                    }
                }
                if (pcMesh->mNumVertices + iNeed > iOutVertexNum) {
                    // don't use this face
                    break;
                }

                vFaces.push_back(aiFace());
                aiFace& rFace = vFaces.back();

                // setup face type and number of indices
                rFace.mNumIndices = iNumIndices;
                rFace.mIndices = new unsigned int[iNumIndices];

                // need to update the output primitive types
                switch (rFace.mNumIndices) {
                case 1:
                    pcMesh->mPrimitiveTypes |= aiPrimitiveType_POINT;
                    break;
                case 2:
                    pcMesh->mPrimitiveTypes |= aiPrimitiveType_LINE;
                    break;
                case 3:
                    pcMesh->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
                    break;
                default:
                    pcMesh->mPrimitiveTypes |= aiPrimitiveType_POLYGON;
                }

                // and copy the contents of the old array, offset by current base
                for (unsigned int v = 0; v < iNumIndices;++v) {
                    unsigned int iIndex = pMesh->mFaces[iBase].mIndices[v];

                    // check whether we do already have this vertex
                    if (0xFFFFFFFF != avWasCopied[iIndex]) {
                        rFace.mIndices[v] = avWasCopied[iIndex];
                        continue;
                    }

                    // copy positions
                    pcMesh->mVertices[pcMesh->mNumVertices] = (pMesh->mVertices[iIndex]);

                    // copy normals
                    if (pMesh->HasNormals()) {
                        pcMesh->mNormals[pcMesh->mNumVertices] = (pMesh->mNormals[iIndex]);
                    }

                    // copy tangents/bitangents
                    if (pMesh->HasTangentsAndBitangents()) {
                        pcMesh->mTangents[pcMesh->mNumVertices] = (pMesh->mTangents[iIndex]);
                        pcMesh->mBitangents[pcMesh->mNumVertices] = (pMesh->mBitangents[iIndex]);
                    }

                    // texture coordinates
                    for (unsigned int c = 0;  c < AI_MAX_NUMBER_OF_TEXTURECOORDS;++c) {
                        if (pMesh->HasTextureCoords( c)) {
                            pcMesh->mTextureCoords[c][pcMesh->mNumVertices] = pMesh->mTextureCoords[c][iIndex];
                        }
                    }
                    // vertex colors
                    for (unsigned int c = 0;  c < AI_MAX_NUMBER_OF_COLOR_SETS;++c) {
                        if (pMesh->HasVertexColors( c)) {
                            pcMesh->mColors[c][pcMesh->mNumVertices] = pMesh->mColors[c][iIndex];
                        }
                    }
                    // check whether we have bone weights assigned to this vertex
                    rFace.mIndices[v] = pcMesh->mNumVertices;
                    if (avPerVertexWeights) {
                        VertexWeightTable& table = avPerVertexWeights[ pcMesh->mNumVertices ];
                        if( !table.empty() ) {
                            for (VertexWeightTable::const_iterator iter =  table.begin();
                                    iter != table.end();++iter) {
                                // allocate the bone weight array if necessary
                                BoneWeightList* pcWeightList = (BoneWeightList*)pcMesh->mBones[(*iter).first];
                                if (nullptr == pcWeightList) {
                                    pcMesh->mBones[(*iter).first] = (aiBone*)(pcWeightList = new BoneWeightList());
                                }
                                pcWeightList->push_back(aiVertexWeight(pcMesh->mNumVertices,(*iter).second));
                            }
                        }
                    }

                    avWasCopied[iIndex] = pcMesh->mNumVertices;
                    pcMesh->mNumVertices++;
                }
                ++iBase;
                if(pcMesh->mNumVertices == iOutVertexNum) {
                    // break here. The face is only added if it was complete
                    break;
                }
            }

            // check which bones we'll need to create for this submesh
            if (pMesh->HasBones()) {
                aiBone** ppCurrent = pcMesh->mBones;
                for (unsigned int k = 0; k < pMesh->mNumBones;++k) {
                    // check whether the bone is existing
                    BoneWeightList* pcWeightList;
                    if ((pcWeightList = (BoneWeightList*)pcMesh->mBones[k])) {
                        aiBone* pcOldBone = pMesh->mBones[k];
                        aiBone* pcOut( nullptr );
                        *ppCurrent++ = pcOut = new aiBone();
                        pcOut->mName = aiString(pcOldBone->mName);
                        pcOut->mOffsetMatrix = pcOldBone->mOffsetMatrix;
                        pcOut->mNumWeights = (unsigned int)pcWeightList->size();
                        pcOut->mWeights = new aiVertexWeight[pcOut->mNumWeights];

                        // copy the vertex weights
                        ::memcpy(pcOut->mWeights,&pcWeightList->operator[](0),
                            pcOut->mNumWeights * sizeof(aiVertexWeight));

                        // delete the temporary bone weight list
                        delete pcWeightList;
                        pcMesh->mNumBones++;
                    }
                }
            }

            // copy the face list to the mesh
            pcMesh->mFaces = new aiFace[vFaces.size()];
            pcMesh->mNumFaces = (unsigned int)vFaces.size();

            for (unsigned int p = 0; p < pcMesh->mNumFaces;++p) {
                pcMesh->mFaces[p] = vFaces[p];
            }

            // add the newly created mesh to the list
            avList.push_back(std::pair<aiMesh*, unsigned int>(pcMesh,a));

            if (iBase == pMesh->mNumFaces) {
                // have all faces ... finish the outer loop, too
                break;
            }
        }

        // delete the per-vertex weight list again
        delete[] avPerVertexWeights;

        // now delete the old mesh data
        delete pMesh;
        return;
    }
    avList.push_back(std::pair<aiMesh*, unsigned int>(pMesh,a));
}